

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCast>>
               (interval_t *ldata,string_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  idx_t iVar6;
  undefined8 uVar7;
  ulong uVar8;
  idx_t row_idx;
  ulong uVar9;
  char **ppcVar10;
  interval_t input;
  interval_t input_00;
  string_t sVar11;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar10 = &(result_data->value).pointer.ptr;
    for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
      uVar8 = uVar9;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)sel_vector->sel_vector[uVar9];
      }
      uVar3 = ldata[uVar8].months;
      uVar5 = ldata[uVar8].days;
      input_00.days = uVar5;
      input_00.months = uVar3;
      input_00.micros = ldata[uVar8].micros;
      sVar11 = StringCast::Operation<duckdb::interval_t>(input_00,(Vector *)dataptr);
      uVar7 = sVar11.value._0_8_;
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar10 + -1);
      paVar1->length = (int)uVar7;
      paVar1->prefix[0] = (char)((ulong)uVar7 >> 0x20);
      paVar1->prefix[1] = (char)((ulong)uVar7 >> 0x28);
      paVar1->prefix[2] = (char)((ulong)uVar7 >> 0x30);
      paVar1->prefix[3] = (char)((ulong)uVar7 >> 0x38);
      *ppcVar10 = sVar11.value._8_8_;
      ppcVar10 = ppcVar10 + 2;
    }
  }
  else {
    ppcVar10 = &(result_data->value).pointer.ptr;
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      iVar6 = row_idx;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)sel_vector->sel_vector[row_idx];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar6 >> 6] >>
           (iVar6 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
      else {
        uVar2 = ldata[iVar6].months;
        uVar4 = ldata[iVar6].days;
        input.days = uVar4;
        input.months = uVar2;
        input.micros = ldata[iVar6].micros;
        sVar11 = StringCast::Operation<duckdb::interval_t>(input,(Vector *)dataptr);
        uVar7 = sVar11.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar10 + -1);
        paVar1->length = (int)uVar7;
        paVar1->prefix[0] = (char)((ulong)uVar7 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar7 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar7 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar7 >> 0x38);
        *ppcVar10 = sVar11.value._8_8_;
      }
      ppcVar10 = ppcVar10 + 2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}